

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EasyScreenCapturerLinux.cpp
# Opt level: O2

StatusCode __thiscall
media::EasyScreenCapturerLinux::SaveBmpBitsAsFile
          (EasyScreenCapturerLinux *this,string *fileName,CaptureBmpData *bmp)

{
  FILE *__s;
  BITMAPFILEHEADER bmpFileHeader;
  
  __s = fopen(*(char **)fileName,"wb");
  bmpFileHeader.bfReserved1 = 0;
  bmpFileHeader.bfReserved2 = 0;
  bmpFileHeader.bfSize = (bmp->m_headerInfo).biSizeImage + 0x36;
  bmpFileHeader.bfType = 0x4d42;
  bmpFileHeader.bfOffBits = 0x36;
  fwrite(&bmpFileHeader,1,0xe,__s);
  fwrite(&bmp->m_headerInfo,1,0x28,__s);
  fwrite((bmp->m_pixels).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1,
         (ulong)(bmp->m_headerInfo).biSizeImage,__s);
  fclose(__s);
  return CAPTURE_OK;
}

Assistant:

StatusCode EasyScreenCapturerLinux::SaveBmpBitsAsFile(
    const std::string &fileName, const CaptureBmpData &bmp)
{
  FILE *outfile = fopen(fileName.c_str(), "wb");

  BITMAPFILEHEADER bmpFileHeader;
  bmpFileHeader.bfReserved1 = 0;
  bmpFileHeader.bfReserved2 = 0;

  bmpFileHeader.bfSize = sizeof(BITMAPFILEHEADER) + sizeof(BITMAPINFOHEADER) +
                         bmp.m_headerInfo.biSizeImage;
  bmpFileHeader.bfType = 'MB';
  bmpFileHeader.bfOffBits = sizeof(BITMAPFILEHEADER) + sizeof(BITMAPINFOHEADER);
  uint32_t dwWriten;
  fwrite(&bmpFileHeader, sizeof(char), sizeof(BITMAPFILEHEADER), outfile);
  fwrite(&bmp.m_headerInfo, sizeof(char), sizeof(BITMAPINFOHEADER), outfile);
  fwrite(bmp.m_pixels.get(), sizeof(char), bmp.m_headerInfo.biSizeImage, outfile);
  fclose(outfile);
  outfile = NULL;
  return StatusCode::CAPTURE_OK;
}